

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O0

bool dxil_spv::analyze_alloca_instruction(Impl *impl,AllocaInst *inst)

{
  uint uVar1;
  TypeID TVar2;
  Type *pTVar3;
  ArrayType *this;
  mapped_type *pmVar4;
  bool bVar5;
  bool simple_scalar;
  Type *elem_type;
  ArrayType *array_type;
  AllocaInst *inst_local;
  Impl *impl_local;
  
  array_type = (ArrayType *)inst;
  inst_local = (AllocaInst *)impl;
  pTVar3 = LLVMBC::Value::getType((Value *)inst);
  uVar1 = LLVMBC::Type::getAddressSpace(pTVar3);
  if ((char)uVar1 == '\0') {
    pTVar3 = LLVMBC::Value::getType((Value *)array_type);
    pTVar3 = LLVMBC::Type::getPointerElementType(pTVar3);
    this = LLVMBC::dyn_cast<LLVMBC::ArrayType>(pTVar3);
    if (this != (ArrayType *)0x0) {
      pTVar3 = LLVMBC::Type::getArrayElementType(&this->super_Type);
      TVar2 = LLVMBC::Type::getTypeID(pTVar3);
      if (TVar2 == FloatTyID) {
        bVar5 = true;
      }
      else if (TVar2 == IntegerTyID) {
        uVar1 = LLVMBC::Type::getIntegerBitWidth(pTVar3);
        bVar5 = uVar1 == 0x20;
      }
      else {
        bVar5 = false;
      }
      if (bVar5) {
        pmVar4 = std::
                 unordered_map<const_LLVMBC::AllocaInst_*,_dxil_spv::AllocaCBVForwardingTracking,_std::hash<const_LLVMBC::AllocaInst_*>,_std::equal_to<const_LLVMBC::AllocaInst_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>_>_>
                 ::operator[]((unordered_map<const_LLVMBC::AllocaInst_*,_dxil_spv::AllocaCBVForwardingTracking,_std::hash<const_LLVMBC::AllocaInst_*>,_std::equal_to<const_LLVMBC::AllocaInst_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>_>_>
                               *)&inst_local[0x1d].super_Instruction.attachments._M_h.
                                  _M_before_begin,(key_type *)&array_type);
        pmVar4->cbv_handle = (Value *)0x0;
        pmVar4->scalar_index_offset = 0;
        pmVar4->stride = 0;
        pmVar4->highest_store_index = 0;
        pmVar4->min_highest_store_index = 0;
        pmVar4->has_load = false;
      }
    }
  }
  return true;
}

Assistant:

bool analyze_alloca_instruction(Converter::Impl &impl, const llvm::AllocaInst *inst)
{
	// Only attempt to track simple 32-bit scalar cases.
	// We don't want to deal with DXR vector types, or weird 16-bit promotion shenanigans.
	if (DXIL::AddressSpace(inst->getType()->getAddressSpace()) != DXIL::AddressSpace::Thread)
		return true;

	if (const auto *array_type = llvm::dyn_cast<llvm::ArrayType>(inst->getType()->getPointerElementType()))
	{
		auto *elem_type = array_type->getArrayElementType();
		bool simple_scalar;

		switch (elem_type->getTypeID())
		{
		case llvm::Type::TypeID::FloatTyID:
			simple_scalar = true;
			break;

		case llvm::Type::TypeID::IntegerTyID:
			simple_scalar = elem_type->getIntegerBitWidth() == 32;
			break;

		default:
			simple_scalar = false;
			break;
		}

		if (simple_scalar)
			impl.alloca_tracking[inst] = {};
	}

	return true;
}